

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_info_base.hpp
# Opt level: O0

void __thiscall asio::detail::thread_info_base::capture_current_exception(thread_info_base *this)

{
  exception_ptr local_38;
  multiple_exceptions local_30;
  multiple_exceptions local_20;
  thread_info_base *local_10;
  thread_info_base *this_local;
  
  local_10 = this;
  if (this->has_pending_exception_ == 0) {
    this->has_pending_exception_ = 1;
    std::current_exception();
    std::__exception_ptr::exception_ptr::operator=(&this->pending_exception_,&local_20.first_);
    std::__exception_ptr::exception_ptr::~exception_ptr(&local_20.first_);
  }
  else if (this->has_pending_exception_ == 1) {
    this->has_pending_exception_ = 2;
    std::__exception_ptr::exception_ptr::exception_ptr(&local_38,&this->pending_exception_);
    multiple_exceptions::multiple_exceptions(&local_30,&local_38);
    std::make_exception_ptr<asio::multiple_exceptions>(&local_20);
    std::__exception_ptr::exception_ptr::operator=
              (&this->pending_exception_,(exception_ptr *)&local_20);
    std::__exception_ptr::exception_ptr::~exception_ptr((exception_ptr *)&local_20);
    multiple_exceptions::~multiple_exceptions(&local_30);
    std::__exception_ptr::exception_ptr::~exception_ptr(&local_38);
  }
  return;
}

Assistant:

void capture_current_exception()
  {
#if defined(ASIO_HAS_STD_EXCEPTION_PTR) \
  && !defined(ASIO_NO_EXCEPTIONS)
    switch (has_pending_exception_)
    {
    case 0:
      has_pending_exception_ = 1;
      pending_exception_ = std::current_exception();
      break;
    case 1:
      has_pending_exception_ = 2;
      pending_exception_ =
        std::make_exception_ptr<multiple_exceptions>(
            multiple_exceptions(pending_exception_));
      break;
    default:
      break;
    }
#endif // defined(ASIO_HAS_STD_EXCEPTION_PTR)
       // && !defined(ASIO_NO_EXCEPTIONS)
  }